

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcShow.c
# Opt level: O2

void Wlc_NtkDumpDot(Wlc_Ntk_t *p,char *pFileName,Vec_Int_t *vBold)

{
  Wlc_Obj_t WVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FILE *__stream;
  Wlc_Obj_t *pWVar7;
  char *pcVar8;
  ulong uVar9;
  word *pwVar10;
  Wlc_Obj_t *pWVar11;
  int *piVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  size_t sStack_60;
  
  if (vBold == (Vec_Int_t *)0x0) {
    if (p->iObj < 0x7d2) goto LAB_003142d9;
  }
  else if (vBold->nSize < 0x7d1) {
LAB_003142d9:
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
      return;
    }
    if (vBold != (Vec_Int_t *)0x0) {
      for (iVar16 = 0; iVar16 < vBold->nSize; iVar16 = iVar16 + 1) {
        iVar3 = Vec_IntEntry(vBold,iVar16);
        pWVar7 = Wlc_NtkObj(p,iVar3);
        *(byte *)pWVar7 = *(byte *)pWVar7 | 0x80;
      }
    }
    iVar16 = Wlc_NtkCreateLevels(p);
    uVar4 = iVar16 + 1;
    if (vBold != (Vec_Int_t *)0x0) {
      uVar4 = Wlc_NtkRemapLevels(p,vBold,uVar4);
    }
    fprintf(__stream,"# %s\n","WLC structure generated by ABC");
    fputc(10,__stream);
    fwrite("digraph WLC {\n",0xe,1,__stream);
    fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
    fwrite("center = true;\n",0xf,1,__stream);
    fwrite("edge [dir = back];\n",0x13,1,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
    fwrite("  edge [style = invis];\n",0x18,1,__stream);
    fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
    fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
    uVar15 = (ulong)uVar4;
    for (uVar9 = uVar15; -1 < (int)uVar9; uVar9 = (ulong)((int)uVar9 - 1)) {
      fprintf(__stream,"  Level%d",uVar9);
      fwrite(" [label = ",10,1,__stream);
      fputc(0x22,__stream);
      fputc(0x22,__stream);
      fwrite("];\n",3,1,__stream);
    }
    fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
    uVar9 = uVar15;
    while (iVar16 = (int)uVar9, -1 < iVar16) {
      fprintf(__stream,"  Level%d",uVar9);
      uVar9 = (ulong)(iVar16 - 1);
      if (iVar16 == 0) {
        fputc(0x3b,__stream);
      }
      else {
        fwrite(" ->",3,1,__stream);
      }
    }
    fputc(10,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fwrite("  LevelTitle1;\n",0xf,1,__stream);
    fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
    fwrite("          fontsize=20,\n",0x17,1,__stream);
    fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
    fwrite("          label=\"",0x11,1,__stream);
    fputs("WLC structure generated by ABC",__stream);
    fwrite("\\n",2,1,__stream);
    pcVar14 = p->pName;
    if (p->pSpec == (char *)0x0) {
      pcVar8 = "unknown";
    }
    else {
      pcVar8 = Extra_FileNameWithoutPath(p->pSpec);
    }
    fprintf(__stream,"Benchmark \\\"%s\\\" from file \\\"%s\\\". ",pcVar14,pcVar8);
    fwrite("\"\n",2,1,__stream);
    fwrite("         ];\n",0xc,1,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fwrite("  LevelTitle2;\n",0xf,1,__stream);
    fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
    fwrite("          fontsize=18,\n",0x17,1,__stream);
    fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
    fwrite("          label=\"",0x11,1,__stream);
    fprintf(__stream,"The word-level network contains %d nodes and spans %d levels.",
            (ulong)(uint)(~(p->vCis).nSize + p->iObj));
    fwrite("\\n",2,1,__stream);
    fwrite("\"\n",2,1,__stream);
    fwrite("         ];\n",0xc,1,__stream);
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",uVar15);
    for (iVar16 = 0; iVar16 < (p->vCos).nSize; iVar16 = iVar16 + 1) {
      pWVar7 = Wlc_NtkCo(p,iVar16);
      if ((vBold == (Vec_Int_t *)0x0) ||
         ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x80) !=
          (undefined1  [24])0x0)) {
        pWVar7 = Wlc_ObjCo2PoFo(p,iVar16);
        uVar9 = ((long)pWVar7 - (long)p->pObjs) / 0x18;
        pcVar8 = Wlc_ObjName(p,(int)uVar9);
        pcVar14 = "T = %d\t\t";
        if ((*(uint *)pWVar7 >> 9 & 1) == 0) {
          pcVar14 = "mem_data_in";
        }
        iVar13 = pWVar7->End - pWVar7->Beg;
        iVar3 = -iVar13;
        if (0 < iVar13) {
          iVar3 = iVar13;
        }
        fprintf(__stream,"  NodePo%d [label = \"%s%s %d\"",uVar9 & 0xffffffff,pcVar8,pcVar14 + 8,
                (ulong)(iVar3 + 1));
        pcVar14 = "box";
        if (iVar16 < (p->vPos).nSize) {
          pcVar14 = "invtriangle";
        }
        fprintf(__stream,", shape = %s",pcVar14);
        fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
        fwrite("];\n",3,1,__stream);
      }
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
    do {
      uVar4 = uVar4 - 1;
      fwrite("{\n",2,1,__stream);
      fwrite("  rank = same;\n",0xf,1,__stream);
      if ((int)uVar4 < 1) {
        fprintf(__stream,"  Level%d;\n",0);
        for (uVar4 = 1; (int)uVar4 < p->iObj; uVar4 = uVar4 + 1) {
          pWVar7 = Wlc_NtkObj(p,uVar4);
          WVar1 = *pWVar7;
          if ((((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3d) ==
                (undefined1  [24])0x1) || ((int)pWVar7->nFanins < 1)) &&
             ((vBold == (Vec_Int_t *)0x0 ||
              ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x80) !=
               (undefined1  [24])0x0)))) {
            if ((undefined1  [24])((undefined1  [24])WVar1 & (undefined1  [24])0x3f) ==
                (undefined1  [24])0x6) {
              iVar3 = pWVar7->End - pWVar7->Beg;
              iVar16 = -iVar3;
              if (0 < iVar3) {
                iVar16 = iVar3;
              }
              fprintf(__stream,"  Node%d [label = \"%d:%d\'h",(ulong)uVar4,(ulong)uVar4,
                      (ulong)(iVar16 + 1));
              uVar5 = pWVar7->End - pWVar7->Beg;
              uVar18 = -uVar5;
              if (0 < (int)uVar5) {
                uVar18 = uVar5;
              }
              pwVar10 = (word *)Wlc_ObjConstValue(pWVar7);
              if (uVar18 < 0x40) {
                iVar3 = pWVar7->End - pWVar7->Beg;
                iVar16 = -iVar3;
                if (0 < iVar3) {
                  iVar16 = iVar3;
                }
                Abc_TtPrintHexArrayRev((FILE *)__stream,pwVar10,iVar16 + 4U >> 2);
              }
              else {
                Abc_TtPrintHexArrayRev((FILE *)__stream,pwVar10,0x10);
                fwrite("...",3,1,__stream);
              }
              fputc(0x22,__stream);
            }
            else {
              uVar9 = ((long)pWVar7 - (long)p->pObjs) / 0x18;
              pcVar14 = Wlc_ObjName(p,(int)uVar9);
              iVar3 = pWVar7->End - pWVar7->Beg;
              iVar16 = -iVar3;
              if (0 < iVar3) {
                iVar16 = iVar3;
              }
              fprintf(__stream,"  Node%d [label = \"%d:%s %d\"",uVar9 & 0xffffffff,
                      uVar9 & 0xffffffff,pcVar14,(ulong)(iVar16 + 1));
              pcVar14 = "triangle";
              if ((p->vFfs2).nSize < 1) {
                if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3d) !=
                    (undefined1  [24])0x1) {
                  __assert_fail("Wlc_ObjIsCi(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                                ,0x12d,"int Wlc_ObjCiId(Wlc_Obj_t *)");
                }
                pcVar14 = "box";
                if ((pWVar7->field_10).Fanins[1] < (p->vPis).nSize) {
                  pcVar14 = "triangle";
                }
              }
              fprintf(__stream,", shape = %s",pcVar14);
              fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
            }
            fwrite("];\n",3,1,__stream);
          }
        }
        fputc(0x7d,__stream);
        fputc(10,__stream);
        fputc(10,__stream);
        fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
        for (iVar16 = 0; iVar3 = (p->vCos).nSize, iVar16 < iVar3; iVar16 = iVar16 + 1) {
          pWVar7 = Wlc_NtkCo(p,iVar16);
          if ((vBold == (Vec_Int_t *)0x0) ||
             ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x80) !=
              (undefined1  [24])0x0)) {
            pWVar7 = Wlc_ObjCo2PoFo(p,iVar16);
            fprintf(__stream,"title2 -> NodePo%d [style = invis];\n",
                    ((long)pWVar7 - (long)p->pObjs) / 0x18 & 0xffffffff);
          }
        }
        uVar9 = 0xffffffffffffffff;
        for (iVar16 = 0; iVar16 < iVar3; iVar16 = iVar16 + 1) {
          Wlc_NtkCo(p,iVar16);
          pWVar7 = Wlc_ObjCo2PoFo(p,iVar16);
          if ((vBold == (Vec_Int_t *)0x0) ||
             ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x80) !=
              (undefined1  [24])0x0)) {
            if (-1 < (int)uVar9) {
              fprintf(__stream,"NodePo%d -> NodePo%d [style = invis];\n",uVar9 & 0xffffffff,
                      ((long)pWVar7 - (long)p->pObjs) / 0x18 & 0xffffffff);
            }
            uVar9 = ((long)pWVar7 - (long)p->pObjs) / 0x18;
          }
          iVar3 = (p->vCos).nSize;
        }
        uVar9 = 0xffffffffffffffff;
        for (iVar16 = 0; iVar16 < (p->vCis).nSize; iVar16 = iVar16 + 1) {
          pWVar7 = Wlc_NtkCi(p,iVar16);
          if ((vBold == (Vec_Int_t *)0x0) ||
             ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x80) !=
              (undefined1  [24])0x0)) {
            if (-1 < (int)uVar9) {
              fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar9 & 0xffffffff,
                      ((long)pWVar7 - (long)p->pObjs) / 0x18 & 0xffffffff);
            }
            uVar9 = ((long)pWVar7 - (long)p->pObjs) / 0x18;
          }
        }
        for (iVar16 = 0; iVar16 < (p->vCos).nSize; iVar16 = iVar16 + 1) {
          pWVar7 = Wlc_NtkCo(p,iVar16);
          if ((vBold == (Vec_Int_t *)0x0) ||
             ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x80) !=
              (undefined1  [24])0x0)) {
            pWVar11 = Wlc_ObjCo2PoFo(p,iVar16);
            fprintf(__stream,"NodePo%d",((long)pWVar11 - (long)p->pObjs) / 0x18 & 0xffffffff);
            fwrite(" -> ",4,1,__stream);
            fprintf(__stream,"Node%d",((long)pWVar7 - (long)p->pObjs) / 0x18 & 0xffffffff);
            fwrite(" [",2,1,__stream);
            pcVar14 = "dotted";
            if ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x40) ==
                (undefined1  [24])0x0) {
              pcVar14 = "solid";
            }
            fprintf(__stream,"style = %s",pcVar14);
            fputc(0x5d,__stream);
            fwrite(";\n",2,1,__stream);
          }
        }
        for (iVar16 = 1; iVar16 < p->iObj; iVar16 = iVar16 + 1) {
          pWVar7 = Wlc_NtkObj(p,iVar16);
          if (((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3d) !=
               (undefined1  [24])0x1) &&
             ((vBold == (Vec_Int_t *)0x0 ||
              ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x80) !=
               (undefined1  [24])0x0)))) {
            for (lVar17 = 0; lVar17 < (int)pWVar7->nFanins; lVar17 = lVar17 + 1) {
              piVar12 = Wlc_ObjFanins(pWVar7);
              uVar4 = piVar12[lVar17];
              if (uVar4 != 0) {
                fprintf(__stream,"Node%d",iVar16);
                fwrite(" -> ",4,1,__stream);
                fprintf(__stream,"Node%d",(ulong)uVar4);
                fwrite(" [",2,1,__stream);
                pWVar11 = Wlc_NtkObj(p,uVar4);
                pcVar14 = "solid";
                if ((undefined1  [24])((undefined1  [24])*pWVar11 & (undefined1  [24])0x40) !=
                    (undefined1  [24])0x0) {
                  pcVar14 = "dotted";
                }
                fprintf(__stream,"style = %s",pcVar14);
                if ((lVar17 == 0) &&
                   ((undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x3f) ==
                    (undefined1  [24])0x8)) {
                  fprintf(__stream,", style = %s","bold");
                }
                fputc(0x5d,__stream);
                fwrite(";\n",2,1,__stream);
              }
            }
          }
        }
        fputc(0x7d,__stream);
        fputc(10,__stream);
        fputc(10,__stream);
        fclose(__stream);
        if (vBold == (Vec_Int_t *)0x0) {
          return;
        }
        Wlc_NtkCleanMarks(p);
        return;
      }
      fprintf(__stream,"  Level%d;\n",(ulong)uVar4);
      for (uVar18 = 1; (int)uVar18 < p->iObj; uVar18 = uVar18 + 1) {
        pWVar7 = Wlc_NtkObj(p,uVar18);
        uVar5 = Vec_IntEntry(&p->vLevels,(int)(((long)pWVar7 - (long)p->pObjs) / 0x18));
        if (uVar5 == uVar4) {
          if ((vBold == (Vec_Int_t *)0x0) || ((*(ushort *)pWVar7 & 0x80) != 0)) {
            uVar5 = *(ushort *)pWVar7 & 0x3f;
            if (uVar5 - 7 < 2) {
              iVar3 = pWVar7->End - pWVar7->Beg;
              iVar16 = -iVar3;
              if (0 < iVar3) {
                iVar16 = iVar3;
              }
              fprintf(__stream,"  Node%d [label = \"%d: %d\"",(ulong)uVar18,(ulong)uVar18,
                      (ulong)(iVar16 + 1));
            }
            else if (uVar5 == 6) {
              iVar3 = pWVar7->End - pWVar7->Beg;
              iVar16 = -iVar3;
              if (0 < iVar3) {
                iVar16 = iVar3;
              }
              fprintf(__stream,"  Node%d [label = \"%d:%d\'h",(ulong)uVar18,(ulong)uVar18,
                      (ulong)(iVar16 + 1));
              uVar6 = pWVar7->End - pWVar7->Beg;
              uVar5 = -uVar6;
              if (0 < (int)uVar6) {
                uVar5 = uVar6;
              }
              pwVar10 = (word *)Wlc_ObjConstValue(pWVar7);
              if (uVar5 < 0x40) {
                iVar3 = pWVar7->End - pWVar7->Beg;
                iVar16 = -iVar3;
                if (0 < iVar3) {
                  iVar16 = iVar3;
                }
                Abc_TtPrintHexArrayRev((FILE *)__stream,pwVar10,iVar16 + 4U >> 2);
              }
              else {
                Abc_TtPrintHexArrayRev((FILE *)__stream,pwVar10,0x10);
                fwrite("...",3,1,__stream);
              }
              fputc(0x22,__stream);
            }
            else {
              pcVar14 = Wlc_ObjTypeName(pWVar7);
              if ((ushort)((short)uVar5 - 0x1aU) < 0xb) {
                fprintf(__stream,"  Node%d [label = \"%d:%s\"",(ulong)uVar18,(ulong)uVar18,pcVar14);
              }
              else {
                iVar3 = pWVar7->End - pWVar7->Beg;
                iVar16 = -iVar3;
                if (0 < iVar3) {
                  iVar16 = iVar3;
                }
                fprintf(__stream,"  Node%d [label = \"%d:%s %d\"",(ulong)uVar18,(ulong)uVar18,
                        pcVar14,(ulong)(iVar16 + 1));
              }
            }
            uVar6 = (uint)*(ushort *)pWVar7;
            uVar5 = uVar6 & 0x3f;
            if (uVar5 == 0x2d) {
              pcVar14 = ", shape = doublecircle";
              sStack_60 = 0x16;
            }
            else {
              if ((ushort)((short)uVar5 - 0x1fU) < 6) {
                pcVar14 = ", shape = diamond";
              }
              else {
                if (uVar5 < 0x1a) {
                  if ((0xc00020U >> (uVar6 & 0x1f) & 1) == 0) {
                    if ((0x3000080U >> (uVar6 & 0x1f) & 1) == 0) {
                      if (uVar5 != 8) goto LAB_00314c4e;
                      pcVar14 = ", shape = trapezium";
                      sStack_60 = 0x13;
                    }
                    else {
                      pcVar14 = ", shape = triangle";
                      sStack_60 = 0x12;
                    }
                  }
                  else {
                    pcVar14 = ", shape = box";
                    sStack_60 = 0xd;
                  }
                  goto LAB_00314bde;
                }
LAB_00314c4e:
                pcVar14 = ", shape = ellipse";
              }
              sStack_60 = 0x11;
            }
LAB_00314bde:
            fwrite(pcVar14,sStack_60,1,__stream);
            if (vBold == (Vec_Int_t *)0x0) {
              uVar2 = *(ushort *)pWVar7 & 0x3f;
              if (uVar2 == 0xf || (ushort)(uVar2 - 0x2b) < 10) goto LAB_00314bf9;
            }
            else if ((char)*(ushort *)pWVar7 < '\0') {
LAB_00314bf9:
              fwrite(", style = filled",0x10,1,__stream);
            }
            fwrite("];\n",3,1,__stream);
          }
        }
      }
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
    } while( true );
  }
  fprintf(_stdout,"Cannot visualize WLC with more than %d nodes.\n",2000);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Writes the graph structure of WLC for DOT.]

  Description [Useful for graph visualization using tools such as GraphViz: 
  http://www.graphviz.org/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_NtkDumpDot( Wlc_Ntk_t * p, char * pFileName, Vec_Int_t * vBold )
{
    FILE * pFile;
    Wlc_Obj_t * pNode;
    int LevelMax, Prev, Level, i;

    if ( vBold ? (Vec_IntSize(vBold) > 2000) : (Wlc_NtkObjNum(p) > 2000) )
    {
        fprintf( stdout, "Cannot visualize WLC with more than %d nodes.\n", 2000 );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Wlc_NtkForEachObjVec( vBold, p, pNode, i )
            pNode->Mark = 1;

    // compute levels
    LevelMax = 1 + Wlc_NtkCreateLevels( p );
    if ( vBold )
        LevelMax = Wlc_NtkRemapLevels( p, vBold, LevelMax );

//    Wlc_NtkForEachObj( p, pNode, i )
//        printf( "Obj=%d Lev=%d\n", i, Wlc_ObjLevel(p, pNode) );
//    printf( "\n" );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "WLC structure generated by ABC" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph WLC {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "WLC structure generated by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\" from file \\\"%s\\\". ", p->pName, p->pSpec ? Extra_FileNameWithoutPath(p->pSpec) : "unknown" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The word-level network contains %d nodes and spans %d levels.", Wlc_NtkObjNum(p)-Wlc_NtkCiNum(p), LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        pNode = Wlc_ObjCo2PoFo(p, i);
        fprintf( pFile, "  NodePo%d [label = \"%s%s %d\"", Wlc_ObjId(p, pNode), Wlc_ObjName(p, Wlc_ObjId(p, pNode)), Wlc_ObjIsPo(pNode)? "":"_in",  Wlc_ObjRange(pNode) ); 
        fprintf( pFile, ", shape = %s", i < Wlc_NtkPoNum(p) ? "invtriangle" : "box" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Wlc_NtkForEachObj( p, pNode, i )
        {
            if ( (int)Wlc_ObjLevel(p, pNode) != Level )
                continue;
            if ( vBold && !pNode->Mark )
                continue;

            if ( pNode->Type == WLC_OBJ_CONST )
            {
                //char * pName = Wlc_ObjName(p, i);
                fprintf( pFile, "  Node%d [label = \"%d:%d\'h", i, i, Wlc_ObjRange(pNode) ); 
                if ( Wlc_ObjRange(pNode) > 64 )
                {
                    Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), 16 );
                    fprintf( pFile, "..." );
                }
                else
                    Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), (Wlc_ObjRange(pNode) + 3) / 4 );
                fprintf( pFile, "\"" ); 
            }
            else if ( pNode->Type == WLC_OBJ_BUF || pNode->Type == WLC_OBJ_MUX )
                fprintf( pFile, "  Node%d [label = \"%d: %d\"", i, i, Wlc_ObjRange(pNode) ); 
            else if ( pNode->Type >= WLC_OBJ_LOGIC_NOT && pNode->Type <= WLC_OBJ_COMP_MOREEQU )
                fprintf( pFile, "  Node%d [label = \"%d:%s\"", i, i, Wlc_ObjTypeName(pNode) ); 
            else
                fprintf( pFile, "  Node%d [label = \"%d:%s %d\"", i, i, Wlc_ObjTypeName(pNode), Wlc_ObjRange(pNode) ); 

            if ( pNode->Type == WLC_OBJ_ARI_MULTI )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( pNode->Type >= WLC_OBJ_COMP_EQU && pNode->Type <= WLC_OBJ_COMP_MOREEQU )
                fprintf( pFile, ", shape = diamond" );
            else if ( pNode->Type == WLC_OBJ_BIT_SELECT || pNode->Type == WLC_OBJ_BIT_CONCAT || pNode->Type == WLC_OBJ_FF )
                fprintf( pFile, ", shape = box" );
            else if ( pNode->Type == WLC_OBJ_BUF || pNode->Type == WLC_OBJ_BIT_ZEROPAD || pNode->Type == WLC_OBJ_BIT_SIGNEXT )
                fprintf( pFile, ", shape = triangle" );
            else if ( pNode->Type == WLC_OBJ_MUX )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );

            if ( vBold ? pNode->Mark : ((pNode->Type >= WLC_OBJ_ARI_ADD && pNode->Type <= WLC_OBJ_ARI_SQUARE) || pNode->Type == WLC_OBJ_BIT_NOT) )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate the CI nodes
    Wlc_NtkForEachObj( p, pNode, i )
    {
        if ( !Wlc_ObjIsCi(pNode) && Wlc_ObjFaninNum(pNode) > 0 )
            continue;
        if ( vBold && !pNode->Mark )
            continue;
        if ( pNode->Type == WLC_OBJ_CONST )
        {
            //char * pName = Wlc_ObjName(p, i);
            fprintf( pFile, "  Node%d [label = \"%d:%d\'h", i, i, Wlc_ObjRange(pNode) ); 
            if ( Wlc_ObjRange(pNode) > 64 )
            {
                Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), 16 );
                fprintf( pFile, "..." );
            }
            else
                Abc_TtPrintHexArrayRev( pFile, (word *)Wlc_ObjConstValue(pNode), (Wlc_ObjRange(pNode) + 3) / 4 );
            fprintf( pFile, "\"" ); 
        }
        else
        {
            fprintf( pFile, "  Node%d [label = \"%d:%s %d\"", Wlc_ObjId(p, pNode), Wlc_ObjId(p, pNode), Wlc_ObjName(p, Wlc_ObjId(p, pNode)), Wlc_ObjRange(pNode) ); 
            fprintf( pFile, ", shape = %s", (Vec_IntSize(&p->vFfs2) > 0 || Wlc_ObjCiId(pNode) < Wlc_NtkPiNum(p)) ? "triangle" : "box" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
        }
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        pNode = Wlc_ObjCo2PoFo( p, i );
        fprintf( pFile, "title2 -> NodePo%d [style = invis];\n", Wlc_ObjId(p, pNode) );
    }
    // generate invisible edges among the COs
    Prev = -1;
    Wlc_NtkForEachCo( p, pNode, i )
    {
        pNode = Wlc_ObjCo2PoFo( p, i );
        if ( vBold && !pNode->Mark )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "NodePo%d -> NodePo%d [style = invis];\n", Prev, Wlc_ObjId(p, pNode) );
        Prev = Wlc_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Wlc_NtkForEachCi( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Wlc_ObjId(p, pNode) );
        Prev = Wlc_ObjId(p, pNode);
    }

    // generate edges
    Wlc_NtkForEachCo( p, pNode, i )
    {
        if ( vBold && !pNode->Mark )
            continue;
        fprintf( pFile, "NodePo%d",  Wlc_ObjId(p, Wlc_ObjCo2PoFo(p, i)) );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Wlc_ObjId(p, pNode) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", pNode->Signed? "dotted" : "solid" );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
    }
    Wlc_NtkForEachObj( p, pNode, i )
    {
        int k, iFanin;
        if ( Wlc_ObjIsCi(pNode) )
            continue;
        if ( vBold && !pNode->Mark )
            continue;
        // generate the edge from this node to the next
        Wlc_ObjForEachFanin( pNode, iFanin, k ) if ( iFanin )
        {
            fprintf( pFile, "Node%d",  i );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  iFanin );
            fprintf( pFile, " [" );
            fprintf( pFile, "style = %s", Wlc_NtkObj(p, iFanin)->Signed? "dotted" : "solid" );
            if ( pNode->Type == WLC_OBJ_MUX && k == 0 )
                fprintf( pFile, ", style = %s", "bold" );
            fprintf( pFile, "]" );
            fprintf( pFile, ";\n" );
        }
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Wlc_NtkCleanMarks( p );
}